

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O2

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
VisitFunctionalExpression<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AsinhId>,std::initializer_list<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>>
          (EExpr *__return_storage_ptr__,
          ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
          *this,initializer_list<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> ea)

{
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>
  fc;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>
  local_50;
  initializer_list<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> local_20;
  
  local_20._M_len = ea._M_len;
  local_20._M_array = ea._M_array;
  local_50.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
       (pointer)&local_50.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
  local_50.super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length = 0;
  local_50.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
  local_50.super_FunctionalConstraint.result_var_ = -1;
  local_50.super_FunctionalConstraint.ctx.value_ = CTX_NONE;
  Exprs2Vars<std::initializer_list<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>,1ul>
            (this,&local_20,
             &local_50.
              super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AsinhId>.
              args_);
  AssignResult2Args<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AsinhId>>
            (__return_storage_ptr__,this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

EExpr VisitFunctionalExpression(ExprArray ea) {
    FuncConstraint fc;
    Exprs2Vars(ea, fc.GetArguments());
    return AssignResult2Args( std::move(fc) );
  }